

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall
btMultiBody::fillConstraintJacobianMultiDof
          (btMultiBody *this,int link,btVector3 *contact_point,btVector3 *normal_ang,
          btVector3 *normal_lin,btScalar *jac,btAlignedObjectArray<float> *scratch_r,
          btAlignedObjectArray<btVector3> *scratch_v,btAlignedObjectArray<btMatrix3x3> *scratch_m)

{
  btVector3 *this_00;
  btVector3 *pbVar1;
  int newsize;
  uint uVar2;
  btVector3 *pbVar3;
  float *pfVar4;
  btMatrix3x3 *m;
  btMultibodyLink *pbVar5;
  btVector3 *pbVar6;
  long lVar7;
  int iVar8;
  float *pfVar9;
  btVector3 *v;
  long lVar10;
  long lVar11;
  long lVar12;
  btScalar bVar13;
  float fVar14;
  btVector3 bVar15;
  btVector3 *local_d8;
  btMatrix3x3 local_b8;
  long local_88;
  long local_80;
  btVector3 *local_78;
  btVector3 p_minus_com_world;
  btMatrix3x3 mtx;
  
  iVar8 = (this->m_links).m_size;
  lVar10 = (long)iVar8;
  newsize = this->m_dofCount;
  btAlignedObjectArray<btVector3>::resize(scratch_v,iVar8 * 3 + 3,mtx.m_el);
  lVar11 = lVar10 + 1;
  btAlignedObjectArray<btMatrix3x3>::resize(scratch_m,(int)lVar11,&mtx);
  pbVar3 = scratch_v->m_data;
  local_78 = pbVar3 + lVar11 * 2;
  mtx.m_el[0].m_floats[0] = 0.0;
  btAlignedObjectArray<float>::resize(scratch_r,newsize,(float *)&mtx);
  pfVar4 = scratch_r->m_data;
  m = scratch_m->m_data;
  p_minus_com_world = operator-(contact_point,&this->m_basePos);
  btMatrix3x3::setRotation(&mtx,&this->m_baseQuat);
  *(ulong *)m->m_el[0].m_floats = CONCAT44(mtx.m_el[0].m_floats[1],mtx.m_el[0].m_floats[0]);
  *(undefined8 *)(m->m_el[0].m_floats + 2) = mtx.m_el[0].m_floats._8_8_;
  *(undefined8 *)m->m_el[1].m_floats = mtx.m_el[1].m_floats._0_8_;
  *(undefined8 *)(m->m_el[1].m_floats + 2) = mtx.m_el[1].m_floats._8_8_;
  *(undefined8 *)m->m_el[2].m_floats = mtx.m_el[2].m_floats._0_8_;
  *(undefined8 *)(m->m_el[2].m_floats + 2) = mtx.m_el[2].m_floats._8_8_;
  bVar15 = btVector3::cross(&p_minus_com_world,normal_lin);
  *jac = normal_ang->m_floats[0] + bVar15.m_floats[0];
  jac[1] = bVar15.m_floats[1] + normal_ang->m_floats[1];
  jac[2] = bVar15.m_floats[2] + normal_ang->m_floats[2];
  jac[3] = normal_lin->m_floats[0];
  jac[4] = normal_lin->m_floats[1];
  jac[5] = normal_lin->m_floats[2];
  bVar15 = operator*(m,&p_minus_com_world);
  *&pbVar3->m_floats = bVar15.m_floats;
  bVar15 = operator*(m,normal_lin);
  *&pbVar3[lVar11].m_floats = bVar15.m_floats;
  bVar15 = operator*(m,normal_ang);
  *&pbVar3[lVar11 * 2].m_floats = bVar15.m_floats;
  for (lVar7 = 6; lVar7 < (long)newsize + 6; lVar7 = lVar7 + 1) {
    jac[lVar7] = 0.0;
  }
  pfVar9 = (float *)0x0;
  if (0 < newsize) {
    pfVar9 = pfVar4;
  }
  if (-1 < link && 0 < iVar8) {
    local_d8 = m[1].m_el + 2;
    lVar7 = 0;
    pbVar6 = pbVar3;
    while( true ) {
      v = pbVar6 + 1;
      pbVar5 = (this->m_links).m_data;
      if (lVar10 * 600 == lVar7) break;
      iVar8 = *(int *)((long)(pbVar5->m_zeroRotParentToThis).super_btQuadWord.m_floats + lVar7 + -4)
      ;
      btMatrix3x3::setRotation
                (&mtx,(btQuaternion *)
                      ((long)(pbVar5->m_cachedRotParentToThis).super_btQuadWord.m_floats + lVar7));
      lVar12 = (long)iVar8 + 1;
      operator*(&local_b8,&mtx,m + lVar12);
      *(undefined8 *)((btMatrix3x3 *)(local_d8 + -2))->m_el[0].m_floats =
           local_b8.m_el[0].m_floats._0_8_;
      *(undefined8 *)(((btMatrix3x3 *)(local_d8 + -2))->m_el[0].m_floats + 2) =
           local_b8.m_el[0].m_floats._8_8_;
      *(undefined8 *)local_d8[-1].m_floats = local_b8.m_el[1].m_floats._0_8_;
      *(undefined8 *)(local_d8[-1].m_floats + 2) = local_b8.m_el[1].m_floats._8_8_;
      *(undefined8 *)local_d8->m_floats = local_b8.m_el[2].m_floats._0_8_;
      *(undefined8 *)(local_d8->m_floats + 2) = local_b8.m_el[2].m_floats._8_8_;
      bVar15 = operator*(&mtx,pbVar3 + lVar11 + lVar12);
      *&v[lVar11].m_floats = bVar15.m_floats;
      bVar15 = operator*(&mtx,local_78 + lVar12);
      *&v[lVar11 * 2].m_floats = bVar15.m_floats;
      local_b8.m_el[0] = operator*(&mtx,pbVar3 + lVar12);
      bVar15 = operator-(local_b8.m_el,
                         (btVector3 *)
                         ((long)(((this->m_links).m_data)->m_cachedRVector).m_floats + lVar7));
      *&v->m_floats = bVar15.m_floats;
      pbVar5 = (this->m_links).m_data;
      uVar2 = *(uint *)((long)(pbVar5->m_cachedWorldTransform).m_basis.m_el[0].m_floats +
                       lVar7 + -0xc);
      if (3 < uVar2) goto LAB_0018ac86;
      this_00 = v + lVar11;
      pbVar1 = v + lVar11 * 2;
      switch(uVar2) {
      case 0:
        local_b8.m_el[0] =
             btVector3::cross((btVector3 *)((long)pbVar5->m_axes[0].m_topVec.m_floats + lVar7),v);
        bVar15 = operator+(local_b8.m_el,
                           (btVector3 *)
                           ((long)((this->m_links).m_data)->m_axes[0].m_bottomVec.m_floats + lVar7))
        ;
        pbVar5 = (this->m_links).m_data;
        pfVar9[*(int *)((long)(pbVar5->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                       lVar7 + -8)] =
             bVar15.m_floats[2] * pbVar6[lVar10 + 2].m_floats[2] +
             v[lVar11].m_floats[0] * bVar15.m_floats[0] +
             bVar15.m_floats[1] * pbVar6[lVar10 + 2].m_floats[1];
        bVar13 = btVector3::dot(pbVar1,(btVector3 *)
                                       ((long)pbVar5->m_axes[0].m_topVec.m_floats + lVar7));
        lVar12 = (long)*(int *)((long)(((this->m_links).m_data)->m_cachedRotParentToThis).
                                      super_btQuadWord.m_floats + lVar7 + -8);
        fVar14 = bVar13 + pfVar9[lVar12];
        break;
      case 1:
        fVar14 = btVector3::dot(this_00,(btVector3 *)
                                        ((long)pbVar5->m_axes[0].m_bottomVec.m_floats + lVar7));
        lVar12 = (long)*(int *)((long)(((this->m_links).m_data)->m_cachedRotParentToThis).
                                      super_btQuadWord.m_floats + lVar7 + -8);
        break;
      case 2:
        local_b8.m_el[0] =
             btVector3::cross((btVector3 *)((long)pbVar5->m_axes[0].m_topVec.m_floats + lVar7),v);
        bVar15 = operator+(local_b8.m_el,
                           (btVector3 *)
                           ((long)((this->m_links).m_data)->m_axes[0].m_bottomVec.m_floats + lVar7))
        ;
        pbVar5 = (this->m_links).m_data;
        pfVar9[*(int *)((long)(pbVar5->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                       lVar7 + -8)] =
             bVar15.m_floats[2] * pbVar6[lVar10 + 2].m_floats[2] +
             v[lVar11].m_floats[0] * bVar15.m_floats[0] +
             bVar15.m_floats[1] * pbVar6[lVar10 + 2].m_floats[1];
        local_80 = lVar7 + 0xa8;
        local_b8.m_el[0] =
             btVector3::cross((btVector3 *)((long)pbVar5->m_axes[1].m_topVec.m_floats + lVar7),v);
        bVar15 = operator+(local_b8.m_el,
                           (btVector3 *)
                           ((long)((this->m_links).m_data)->m_axes[1].m_bottomVec.m_floats + lVar7))
        ;
        pbVar5 = (this->m_links).m_data;
        pfVar9[(long)*(int *)((long)(pbVar5->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                             lVar7 + -8) + 1] =
             bVar15.m_floats[2] * pbVar6[lVar10 + 2].m_floats[2] +
             v[lVar11].m_floats[0] * bVar15.m_floats[0] +
             bVar15.m_floats[1] * pbVar6[lVar10 + 2].m_floats[1];
        local_88 = lVar7 + 200;
        local_b8.m_el[0] =
             btVector3::cross((btVector3 *)((long)pbVar5->m_axes[2].m_topVec.m_floats + lVar7),v);
        bVar15 = operator+(local_b8.m_el,
                           (btVector3 *)
                           ((long)((this->m_links).m_data)->m_axes[2].m_bottomVec.m_floats + lVar7))
        ;
        pbVar5 = (this->m_links).m_data;
        pfVar9[(long)*(int *)((long)(pbVar5->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                             lVar7 + -8) + 2] =
             bVar15.m_floats[2] * pbVar6[lVar10 + 2].m_floats[2] +
             v[lVar11].m_floats[0] * bVar15.m_floats[0] +
             bVar15.m_floats[1] * pbVar6[lVar10 + 2].m_floats[1];
        bVar13 = btVector3::dot(pbVar1,(btVector3 *)
                                       ((long)pbVar5->m_axes[0].m_topVec.m_floats + lVar7));
        pbVar5 = (this->m_links).m_data;
        iVar8 = *(int *)((long)(pbVar5->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                        lVar7 + -8);
        pfVar9[iVar8] = bVar13 + pfVar9[iVar8];
        bVar13 = btVector3::dot(pbVar1,(btVector3 *)
                                       ((long)(pbVar5->m_inertiaLocal).m_floats + local_80 + -4));
        pbVar5 = (this->m_links).m_data;
        lVar12 = (long)*(int *)((long)(pbVar5->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                               lVar7 + -8);
        pfVar9[lVar12 + 1] = bVar13 + pfVar9[lVar12 + 1];
        bVar13 = btVector3::dot(pbVar1,(btVector3 *)
                                       ((long)(pbVar5->m_inertiaLocal).m_floats + local_88 + -4));
        lVar12 = (long)*(int *)((long)(((this->m_links).m_data)->m_cachedRotParentToThis).
                                      super_btQuadWord.m_floats + lVar7 + -8);
        fVar14 = bVar13 + pfVar9[lVar12 + 2];
        goto LAB_0018ac51;
      case 3:
        bVar15 = btVector3::cross((btVector3 *)((long)pbVar5->m_axes[0].m_topVec.m_floats + lVar7),v
                                 );
        pbVar1 = (btVector3 *)
                 ((long)((this->m_links).m_data)->m_axes[1].m_bottomVec.m_floats + lVar7);
        pfVar9[(int)pbVar1[9].m_floats[0]] =
             bVar15.m_floats[2] * pbVar6[lVar10 + 2].m_floats[2] +
             v[lVar11].m_floats[0] * bVar15.m_floats[0] +
             bVar15.m_floats[1] * pbVar6[lVar10 + 2].m_floats[1];
        bVar13 = btVector3::dot(this_00,pbVar1);
        pbVar5 = (this->m_links).m_data;
        pfVar9[(long)*(int *)((long)(pbVar5->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                             lVar7 + -8) + 1] = bVar13;
        fVar14 = btVector3::dot(this_00,(btVector3 *)
                                        ((long)pbVar5->m_axes[2].m_bottomVec.m_floats + lVar7));
        lVar12 = (long)*(int *)((long)(((this->m_links).m_data)->m_cachedRotParentToThis).
                                      super_btQuadWord.m_floats + lVar7 + -8);
LAB_0018ac51:
        pfVar9[lVar12 + 2] = fVar14;
        goto LAB_0018ac86;
      }
      pfVar9[lVar12] = fVar14;
LAB_0018ac86:
      lVar7 = lVar7 + 600;
      local_d8 = local_d8 + 3;
      pbVar6 = v;
    }
    for (; link != -1; link = pbVar5[link].m_parent) {
      iVar8 = pbVar5[link].m_dofCount;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      for (lVar7 = 0; iVar8 != (int)lVar7; lVar7 = lVar7 + 1) {
        jac[(int)lVar7 + pbVar5[link].m_dofOffset + 6] = pfVar9[pbVar5[link].m_dofOffset + lVar7];
      }
    }
  }
  return;
}

Assistant:

void btMultiBody::fillConstraintJacobianMultiDof(int link,
                                    const btVector3 &contact_point,
									const btVector3 &normal_ang,
                                    const btVector3 &normal_lin,
                                    btScalar *jac,
                                    btAlignedObjectArray<btScalar> &scratch_r,
                                    btAlignedObjectArray<btVector3> &scratch_v,
                                    btAlignedObjectArray<btMatrix3x3> &scratch_m) const
{
    // temporary space
	int num_links = getNumLinks();
	int m_dofCount = getNumDofs();
    scratch_v.resize(3*num_links + 3);			//(num_links + base) offsets + (num_links + base) normals_lin + (num_links + base) normals_ang
    scratch_m.resize(num_links + 1);

    btVector3 * v_ptr = &scratch_v[0];
    btVector3 * p_minus_com_local = v_ptr; v_ptr += num_links + 1;
    btVector3 * n_local_lin = v_ptr; v_ptr += num_links + 1;
	btVector3 * n_local_ang = v_ptr; v_ptr += num_links + 1;
    btAssert(v_ptr - &scratch_v[0] == scratch_v.size());

    scratch_r.resize(m_dofCount);
    btScalar * results = m_dofCount > 0 ? &scratch_r[0] : 0;

    btMatrix3x3 * rot_from_world = &scratch_m[0];

    const btVector3 p_minus_com_world = contact_point - m_basePos;
	const btVector3 &normal_lin_world = normal_lin;							//convenience
	const btVector3 &normal_ang_world = normal_ang;

    rot_from_world[0] = btMatrix3x3(m_baseQuat);    
    
    // omega coeffients first.
    btVector3 omega_coeffs_world;
    omega_coeffs_world = p_minus_com_world.cross(normal_lin_world);
	jac[0] = omega_coeffs_world[0] + normal_ang_world[0];
	jac[1] = omega_coeffs_world[1] + normal_ang_world[1];
	jac[2] = omega_coeffs_world[2] + normal_ang_world[2];
    // then v coefficients
    jac[3] = normal_lin_world[0];
    jac[4] = normal_lin_world[1];
    jac[5] = normal_lin_world[2];

	//create link-local versions of p_minus_com and normal
	p_minus_com_local[0] = rot_from_world[0] * p_minus_com_world;
    n_local_lin[0] = rot_from_world[0] * normal_lin_world;
	n_local_ang[0] = rot_from_world[0] * normal_ang_world;

    // Set remaining jac values to zero for now.
    for (int i = 6; i < 6 + m_dofCount; ++i) 
	{
        jac[i] = 0;
    }

    // Qdot coefficients, if necessary.
    if (num_links > 0 && link > -1) {

        // TODO: speed this up -- don't calculate for m_links we don't need.
        // (Also, we are making 3 separate calls to this function, for the normal & the 2 friction directions,
        // which is resulting in repeated work being done...)

        // calculate required normals & positions in the local frames.
        for (int i = 0; i < num_links; ++i) {

            // transform to local frame
            const int parent = m_links[i].m_parent;
            const btMatrix3x3 mtx(m_links[i].m_cachedRotParentToThis);
            rot_from_world[i+1] = mtx * rot_from_world[parent+1];

            n_local_lin[i+1] = mtx * n_local_lin[parent+1];
			n_local_ang[i+1] = mtx * n_local_ang[parent+1];
            p_minus_com_local[i+1] = mtx * p_minus_com_local[parent+1] - m_links[i].m_cachedRVector;

			// calculate the jacobian entry
			switch(m_links[i].m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					results[m_links[i].m_dofOffset] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset] += n_local_ang[i+1].dot(m_links[i].getAxisTop(0));
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					results[m_links[i].m_dofOffset] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(0));
					break;
				}
				case btMultibodyLink::eSpherical:
				{
					results[m_links[i].m_dofOffset + 0] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset + 1] = n_local_lin[i+1].dot(m_links[i].getAxisTop(1).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(1));
					results[m_links[i].m_dofOffset + 2] = n_local_lin[i+1].dot(m_links[i].getAxisTop(2).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(2));
										
					results[m_links[i].m_dofOffset + 0] += n_local_ang[i+1].dot(m_links[i].getAxisTop(0));
					results[m_links[i].m_dofOffset + 1] += n_local_ang[i+1].dot(m_links[i].getAxisTop(1));
					results[m_links[i].m_dofOffset + 2] += n_local_ang[i+1].dot(m_links[i].getAxisTop(2));

					break;
				}
				case btMultibodyLink::ePlanar:
				{
					results[m_links[i].m_dofOffset + 0] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]));// + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset + 1] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(1));
					results[m_links[i].m_dofOffset + 2] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(2));

					break;
				}
				default:
				{
				}
			}
            
        }

        // Now copy through to output.
		//printf("jac[%d] = ", link);
        while (link != -1) 
		{
			for(int dof = 0; dof < m_links[link].m_dofCount; ++dof)
			{
				jac[6 + m_links[link].m_dofOffset + dof] = results[m_links[link].m_dofOffset + dof];
				//printf("%.2f\t", jac[6 + m_links[link].m_dofOffset + dof]);
			}
            
			link = m_links[link].m_parent;
        }
		//printf("]\n");
    }
}